

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_container.h
# Opt level: O3

void __thiscall
midi_container::limit_port_number<unsigned_long>(midi_container *this,unsigned_long *number)

{
  pointer puVar1;
  pointer puVar2;
  bool bVar3;
  pointer puVar4;
  pointer puVar5;
  uchar local_11;
  
  puVar1 = (this->m_port_numbers).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->m_port_numbers).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar2 != puVar1) {
    puVar4 = (pointer)0x0;
    puVar5 = (pointer)0x1;
    do {
      if (*number == (ulong)puVar1[(long)puVar4]) goto LAB_0010838d;
      bVar3 = puVar5 < puVar2 + -(long)puVar1;
      puVar4 = puVar5;
      puVar5 = (pointer)(ulong)((int)puVar5 + 1);
    } while (bVar3);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->m_port_numbers,&local_11);
  puVar4 = (this->m_port_numbers).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish +
           ~(ulong)(this->m_port_numbers).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
LAB_0010838d:
  *number = (unsigned_long)puVar4;
  return;
}

Assistant:

void limit_port_number(T & number)
    {
        for ( unsigned i = 0; i < m_port_numbers.size(); i++ )
        {
            if ( m_port_numbers[ i ] == number )
            {
                number = i;
                return;
            }
        }
        m_port_numbers.push_back( (const uint8_t) number );
        number = m_port_numbers.size() - 1;
    }